

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O0

bool __thiscall
Assimp::Ogre::OgreImporter::ReadPass
          (OgreImporter *this,string *passName,stringstream *ss,aiMaterial *material)

{
  bool bVar1;
  __type _Var2;
  Logger *pLVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *pbVar5;
  void *pvVar6;
  string *textureUnitName_00;
  undefined1 local_660 [8];
  string textureUnitName;
  string local_4c8;
  undefined1 local_4a8 [8];
  aiColor3D color;
  float b;
  float g;
  float r;
  allocator<char> local_469;
  undefined1 local_468 [8];
  string partTextureUnit;
  undefined1 local_440 [8];
  string partEmissive;
  undefined1 local_418 [8];
  string partSpecular;
  undefined1 local_3f0 [8];
  string partDiffuse;
  undefined1 local_3c8 [8];
  string partAmbient;
  string local_230;
  undefined4 local_20c;
  fpos<__mbstate_t> local_208;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_80;
  undefined1 local_50 [8];
  string linePart;
  aiMaterial *material_local;
  stringstream *ss_local;
  string *passName_local;
  OgreImporter *this_local;
  
  linePart.field_2._8_8_ = material;
  std::__cxx11::string::string((string *)local_50);
  std::operator>>((istream *)ss,(string *)local_50);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)partBlockStart_abi_cxx11_);
  if (bVar1) {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[55]>
              (&local_1f8,(char (*) [55])"Invalid material: Pass block start missing near index ");
    local_208 = (fpos<__mbstate_t>)std::istream::tellg();
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1f8,&local_208);
    Formatter::basic_formatter::operator_cast_to_string(&local_80,pbVar5);
    Logger::error(pLVar3,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1f8);
    this_local._7_1_ = false;
    local_20c = 1;
  }
  else {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[9]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&partAmbient.field_2 + 8),(char (*) [9])"  pass \'");
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        (partAmbient.field_2._M_local_buf + 8),passName);
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar4,(char (*) [2])0xb97894);
    Formatter::basic_formatter::operator_cast_to_string(&local_230,pbVar5);
    Logger::debug(pLVar3,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&partAmbient.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,"ambient",
               (allocator<char> *)(partDiffuse.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(partDiffuse.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3f0,"diffuse",
               (allocator<char> *)(partSpecular.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(partSpecular.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_418,"specular",
               (allocator<char> *)(partEmissive.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(partEmissive.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_440,"emissive",
               (allocator<char> *)(partTextureUnit.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(partTextureUnit.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_468,"texture_unit",&local_469);
    std::allocator<char>::~allocator(&local_469);
    while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_50,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)partBlockEnd_abi_cxx11_), bVar1) {
      std::operator>>((istream *)ss,(string *)local_50);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)partComment_abi_cxx11_);
      if (_Var2) {
        SkipLine((string *)&g,ss);
        std::__cxx11::string::~string((string *)&g);
      }
      else {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3c8);
        if ((((_Var2) ||
             (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_50,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_3f0), _Var2)) ||
            (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_50,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_418), _Var2)) ||
           (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_440), _Var2)) {
          pvVar6 = (void *)std::istream::operator>>(ss,&b);
          pvVar6 = (void *)std::istream::operator>>(pvVar6,&color.b);
          std::istream::operator>>(pvVar6,&color.g);
          aiColor3D::aiColor3D((aiColor3D *)local_4a8,b,color.b,color.g);
          pLVar3 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[4]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&textureUnitName.field_2 + 8),(char (*) [4])0xbc126e);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             (textureUnitName.field_2._M_local_buf + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_50);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar4,(char (*) [2])0xbc1270);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar4,&b);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar4,(char (*) [2])0xbc1270);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar4,&color.b);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar4,(char (*) [2])0xbc1270);
          pbVar5 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar4,&color.g);
          Formatter::basic_formatter::operator_cast_to_string(&local_4c8,pbVar5);
          Logger::debug(pLVar3,&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&textureUnitName.field_2 + 8));
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3c8);
          if (_Var2) {
            aiMaterial::AddProperty
                      ((aiMaterial *)linePart.field_2._8_8_,(aiColor3D *)local_4a8,1,"$clr.ambient",
                       0,0);
          }
          else {
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_3f0);
            if (_Var2) {
              aiMaterial::AddProperty
                        ((aiMaterial *)linePart.field_2._8_8_,(aiColor3D *)local_4a8,1,
                         "$clr.diffuse",0,0);
            }
            else {
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_50,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_418);
              if (_Var2) {
                aiMaterial::AddProperty
                          ((aiMaterial *)linePart.field_2._8_8_,(aiColor3D *)local_4a8,1,
                           "$clr.specular",0,0);
              }
              else {
                _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_50,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_440);
                if (_Var2) {
                  aiMaterial::AddProperty
                            ((aiMaterial *)linePart.field_2._8_8_,(aiColor3D *)local_4a8,1,
                             "$clr.emissive",0,0);
                }
              }
            }
          }
        }
        else {
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_468);
          if (_Var2) {
            SkipLine((string *)local_660,ss);
            textureUnitName_00 = Trim((string *)local_660,true);
            ReadTextureUnit(this,textureUnitName_00,ss,(aiMaterial *)linePart.field_2._8_8_);
            std::__cxx11::string::~string((string *)local_660);
          }
        }
      }
    }
    this_local._7_1_ = true;
    local_20c = 1;
    std::__cxx11::string::~string((string *)local_468);
    std::__cxx11::string::~string((string *)local_440);
    std::__cxx11::string::~string((string *)local_418);
    std::__cxx11::string::~string((string *)local_3f0);
    std::__cxx11::string::~string((string *)local_3c8);
  }
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool OgreImporter::ReadPass(const std::string &passName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Pass block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F("  pass '", passName, "'");

    const string partAmbient     = "ambient";
    const string partDiffuse     = "diffuse";
    const string partSpecular    = "specular";
    const string partEmissive    = "emissive";
    const string partTextureUnit = "texture_unit";

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        // Colors
        /// @todo Support alpha via aiColor4D.
        if (linePart == partAmbient || linePart == partDiffuse || linePart == partSpecular || linePart == partEmissive)
        {
            float r, g, b;
            ss >> r >> g >> b;
            const aiColor3D color(r, g, b);

            ASSIMP_LOG_DEBUG_F( "   ", linePart, " ", r, " ", g, " ", b);

            if (linePart == partAmbient)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_AMBIENT);
            }
            else if (linePart == partDiffuse)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_DIFFUSE);
            }
            else if (linePart == partSpecular)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_SPECULAR);
            }
            else if (linePart == partEmissive)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_EMISSIVE);
            }
        }
        else if (linePart == partTextureUnit)
        {
            string textureUnitName = SkipLine(ss);
            ReadTextureUnit(Trim(textureUnitName), ss, material);
        }
    }
    return true;
}